

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFExporter::writeObjects(D3MFExporter *this)

{
  aiNode *this_00;
  aiMesh *mesh;
  ostream *poVar1;
  char *pcVar2;
  aiMesh *currentMesh;
  uint j;
  aiNode *currentNode;
  aiNode *paStack_18;
  uint i;
  aiNode *root;
  D3MFExporter *this_local;
  
  if (this->mScene->mRootNode != (aiNode *)0x0) {
    paStack_18 = this->mScene->mRootNode;
    root = (aiNode *)this;
    for (currentNode._4_4_ = 0; currentNode._4_4_ < paStack_18->mNumChildren;
        currentNode._4_4_ = currentNode._4_4_ + 1) {
      this_00 = paStack_18->mChildren[currentNode._4_4_];
      if (this_00 != (aiNode *)0x0) {
        poVar1 = std::operator<<((ostream *)&this->mModelOutput,"<");
        poVar1 = std::operator<<(poVar1,(string *)XmlTag::object_abi_cxx11_);
        poVar1 = std::operator<<(poVar1," id=\"");
        pcVar2 = aiString::C_Str(&this_00->mName);
        poVar1 = std::operator<<(poVar1,pcVar2);
        std::operator<<(poVar1,"\" type=\"model\">");
        std::ostream::operator<<(&this->mModelOutput,std::endl<char,std::char_traits<char>>);
        for (currentMesh._4_4_ = 0; currentMesh._4_4_ < this_00->mNumMeshes;
            currentMesh._4_4_ = currentMesh._4_4_ + 1) {
          mesh = this->mScene->mMeshes[this_00->mMeshes[currentMesh._4_4_]];
          if (mesh != (aiMesh *)0x0) {
            writeMesh(this,mesh);
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->mBuildItems,(value_type_conflict1 *)((long)&currentNode + 4));
        poVar1 = std::operator<<((ostream *)&this->mModelOutput,"</");
        poVar1 = std::operator<<(poVar1,(string *)XmlTag::object_abi_cxx11_);
        std::operator<<(poVar1,">");
        std::ostream::operator<<(&this->mModelOutput,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void D3MFExporter::writeObjects() {
    if ( nullptr == mScene->mRootNode ) {
        return;
    }

    aiNode *root = mScene->mRootNode;
    for ( unsigned int i = 0; i < root->mNumChildren; ++i ) {
        aiNode *currentNode( root->mChildren[ i ] );
        if ( nullptr == currentNode ) {
            continue;
        }
        mModelOutput << "<" << XmlTag::object << " id=\"" << currentNode->mName.C_Str() << "\" type=\"model\">";
        mModelOutput << std::endl;
        for ( unsigned int j = 0; j < currentNode->mNumMeshes; ++j ) {
            aiMesh *currentMesh = mScene->mMeshes[ currentNode->mMeshes[ j ] ];
            if ( nullptr == currentMesh ) {
                continue;
            }
            writeMesh( currentMesh );
        }
        mBuildItems.push_back( i );

        mModelOutput << "</" << XmlTag::object << ">";
        mModelOutput << std::endl;
    }
}